

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_printer.cpp
# Opt level: O1

void printGraphShortestPathViz(Graph *g,vector<unsigned_long,_std::allocator<unsigned_long>_> *pred)

{
  type *ptVar1;
  int *piVar2;
  long *plVar3;
  long *plVar4;
  ostream *poVar5;
  unsigned_long uVar6;
  AdjList *g_2;
  type extraout_RDX;
  type tVar7;
  char *pcVar8;
  long lVar9;
  type *ptVar10;
  graph_type *cg;
  bool bVar11;
  EdgeIterator ei;
  EdgeIterator ei_end;
  undefined8 uStack_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 uStack_158;
  undefined7 uStack_157;
  char cStack_150;
  long *local_148;
  unsigned_long local_140;
  long *local_138;
  unsigned_long local_130;
  long local_128;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined1 uStack_108;
  undefined8 uStack_107;
  long *local_f8;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_d0;
  undefined1 *local_40;
  undefined8 *local_38;
  
  uStack_158 = 0;
  uStack_157 = 0;
  cStack_150 = '\0';
  uStack_168 = 0;
  local_160 = 0;
  uStack_15f = 0;
  uStack_108 = 0;
  uStack_107 = 0;
  local_118 = 0;
  local_110 = 0;
  uStack_10f = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"digraph D {\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  rankdir=LR\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  size=\"5,3\"\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ratio=\"fill\"\n",0xf)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  edge[style=\"bold\"]\n",0x15);
  pcVar8 = "  node[shape=\"circle\"]\n";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  node[shape=\"circle\"]\n",0x17);
  ptVar10 = (type *)(g->super_type).m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (type *)(g->super_type).m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  local_d0.first.vEnd.m_value = (long)ptVar1 - (long)ptVar10 >> 5;
  if (ptVar1 == ptVar10) {
    local_d0.first.vCurr.m_value = 0;
    local_d0.first.edges.super_type.m_initialized = false;
    tVar7 = extraout_RDX;
  }
  else {
    tVar7 = *ptVar10;
    pcVar8 = *(char **)(ptVar10 + 1);
    if ((type)pcVar8 == tVar7) {
      ptVar10 = ptVar10 + 5;
      local_d0.first.vCurr.m_value = 0;
      do {
        if (local_d0.first.vEnd.m_value - 1 == local_d0.first.vCurr.m_value) {
          local_d0.first.edges.super_type.m_initialized = false;
          local_d0.first.vCurr.m_value = local_d0.first.vEnd.m_value;
          goto LAB_0011111c;
        }
        tVar7 = (type)((_Vector_impl_data *)(ptVar10 + -1))->_M_start;
        pcVar8 = *(char **)ptVar10;
        ptVar10 = ptVar10 + 4;
        local_d0.first.vCurr.m_value = local_d0.first.vCurr.m_value + 1;
      } while ((type)pcVar8 == tVar7);
    }
    else {
      local_d0.first.vCurr.m_value = 0;
    }
    local_d0.first.edges.super_type.m_initialized = true;
  }
LAB_0011111c:
  local_d0.first.vBegin.m_value = 0;
  if (local_d0.first.edges.super_type.m_initialized) {
    local_d0.first.edges.super_type.m_storage.dummy_.aligner_ = tVar7;
    local_d0.first.edges.super_type.m_storage.dummy_._8_8_ = local_d0.first.vCurr.m_value;
    local_d0.first.edges.super_type.m_storage.dummy_._16_8_ = pcVar8;
    local_d0.first.edges.super_type.m_storage.dummy_._24_8_ = local_d0.first.vCurr.m_value;
  }
  local_d0.second.vBegin.m_value = 0;
  local_d0.second.edges.super_type.m_initialized = false;
  local_38 = &local_118;
  local_d0.first.m_g = g;
  local_d0.second.vCurr.m_value = local_d0.first.vEnd.m_value;
  local_d0.second.vEnd.m_value = local_d0.first.vEnd.m_value;
  local_d0.second.m_g = g;
  local_40 = (undefined1 *)&uStack_168;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_d0);
  if (local_d0.second.edges.super_type.m_initialized == true) {
    local_d0.second.edges.super_type.m_initialized = false;
  }
  if (local_d0.first.edges.super_type.m_initialized == true) {
    local_d0.first.edges.super_type.m_initialized = false;
  }
LAB_00111377:
  do {
    uVar6 = local_140;
    if (CONCAT71(uStack_15f,local_160) == CONCAT71(uStack_10f,local_110)) {
      if (CONCAT71(uStack_15f,local_160) == CONCAT71(uStack_157,uStack_158)) {
LAB_00111392:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        return;
      }
      if ((cStack_150 == '\0') || (uStack_107._7_1_ == '\0')) goto LAB_00111402;
      if (local_148 == local_f8) goto LAB_00111392;
    }
    if (cStack_150 == '\0') {
LAB_00111402:
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                    "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    lVar9 = *local_148;
    piVar2 = (int *)local_148[1];
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," -> ",4);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[label=\"",8);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*piVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    bVar11 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar9] == uVar6;
    pcVar8 = ", color=\"grey\"";
    if (bVar11) {
      pcVar8 = ", color=\"black\"";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar8,(ulong)bVar11 | 0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    if (cStack_150 == '\0') {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                    "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    local_148 = local_148 + 2;
    if (local_148 == local_138) {
      uVar6 = CONCAT71(uStack_15f,local_160);
      lVar9 = uVar6 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_157,uStack_158) - 1U == uVar6) {
          local_160 = uStack_158;
          uStack_15f = uStack_157;
          goto LAB_00111377;
        }
        plVar3 = *(long **)(*(long *)(local_128 + 0x18) + -8 + lVar9);
        plVar4 = *(long **)(*(long *)(local_128 + 0x18) + lVar9);
        lVar9 = lVar9 + 0x20;
        uVar6 = uVar6 + 1;
      } while (plVar4 == plVar3);
      local_160 = (undefined1)uVar6;
      uStack_15f = (undefined7)(uVar6 >> 8);
      local_148 = plVar3;
      local_140 = uVar6;
      local_138 = plVar4;
      local_130 = uVar6;
    }
  } while( true );
}

Assistant:

void printGraphShortestPathViz(Graph g, std::vector<unsigned long> pred)
{
    EdgeIterator ei, ei_end;

    std::cout << "digraph D {\n"
                 << "  rankdir=LR\n"
                 << "  size=\"5,3\"\n"
                 << "  ratio=\"fill\"\n"
                 << "  edge[style=\"bold\"]\n" << "  node[shape=\"circle\"]\n";

    Vertex u,v;
    for (tie(ei, ei_end) = edges(g); ei != ei_end; ++ei) {
        Edge e = *ei;
        u = source(e, g);
        v = target(e, g);
        std::cout << "  " << u << " -> " << v << "[label=\"" << get(get(&EdgeProperties::weight, g), e) << "\"";
        if (pred[v] == u) std::cout << ", color=\"black\"";
        else std::cout << ", color=\"grey\"" ;
        std::cout << "]" << std::endl;
    }
    std::cout << "}" << std::endl;
}